

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casts.h
# Opt level: O1

void __thiscall
CoreML::Specification::PrecisionRecallCurve::CheckTypeAndMergeFrom
          (PrecisionRecallCurve *this,MessageLite *from)

{
  ulong uVar1;
  LogMessage *other;
  FloatVector *pFVar2;
  undefined1 *puVar3;
  Arena *pAVar4;
  LogFinisher LStack_51;
  LogMessage LStack_50;
  
  if (from->_vptr_MessageLite != (_func_int **)&PTR__PrecisionRecallCurve_004b00c8) {
    __assert_fail("f == nullptr || dynamic_cast<To>(f) != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/stubs/casts.h"
                  ,0x5e,
                  "To google::protobuf::internal::down_cast(From *) [To = const CoreML::Specification::PrecisionRecallCurve *, From = const google::protobuf::MessageLite]"
                 );
  }
  if ((PrecisionRecallCurve *)from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&LStack_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O1/mlmodel/format/DataStructures.pb.cc"
               ,0xacb);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&LStack_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&LStack_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&LStack_50);
  }
  if ((from != (MessageLite *)_PrecisionRecallCurve_default_instance_) &&
     (from[1]._vptr_MessageLite != (_func_int **)0x0)) {
    if (this->precisionvalues_ == (FloatVector *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      pFVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FloatVector>
                         (pAVar4);
      this->precisionvalues_ = pFVar2;
    }
    puVar3 = (undefined1 *)from[1]._vptr_MessageLite;
    if ((FloatVector *)puVar3 == (FloatVector *)0x0) {
      puVar3 = _FloatVector_default_instance_;
    }
    FloatVector::MergeFrom(this->precisionvalues_,(FloatVector *)puVar3);
  }
  if ((from != (MessageLite *)_PrecisionRecallCurve_default_instance_) &&
     (from[1]._internal_metadata_.ptr_ != 0)) {
    if (this->precisionconfidencethresholds_ == (FloatVector *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      pFVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FloatVector>
                         (pAVar4);
      this->precisionconfidencethresholds_ = pFVar2;
    }
    puVar3 = (undefined1 *)from[1]._internal_metadata_.ptr_;
    if ((FloatVector *)puVar3 == (FloatVector *)0x0) {
      puVar3 = _FloatVector_default_instance_;
    }
    FloatVector::MergeFrom(this->precisionconfidencethresholds_,(FloatVector *)puVar3);
  }
  if ((from != (MessageLite *)_PrecisionRecallCurve_default_instance_) &&
     (from[2]._vptr_MessageLite != (_func_int **)0x0)) {
    if (this->recallvalues_ == (FloatVector *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      pFVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FloatVector>
                         (pAVar4);
      this->recallvalues_ = pFVar2;
    }
    puVar3 = (undefined1 *)from[2]._vptr_MessageLite;
    if ((FloatVector *)puVar3 == (FloatVector *)0x0) {
      puVar3 = _FloatVector_default_instance_;
    }
    FloatVector::MergeFrom(this->recallvalues_,(FloatVector *)puVar3);
  }
  if ((from != (MessageLite *)_PrecisionRecallCurve_default_instance_) &&
     (from[2]._internal_metadata_.ptr_ != 0)) {
    if (this->recallconfidencethresholds_ == (FloatVector *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      pFVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FloatVector>
                         (pAVar4);
      this->recallconfidencethresholds_ = pFVar2;
    }
    puVar3 = (undefined1 *)from[2]._internal_metadata_.ptr_;
    if ((FloatVector *)puVar3 == (FloatVector *)0x0) {
      puVar3 = _FloatVector_default_instance_;
    }
    FloatVector::MergeFrom(this->recallconfidencethresholds_,(FloatVector *)puVar3);
  }
  uVar1 = (from->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

inline To down_cast(From* f) {                   // so we only accept pointers
  // Ensures that To is a sub-type of From *.  This test is here only
  // for compile-time type checking, and has no overhead in an
  // optimized build at run-time, as it will be optimized away
  // completely.
  if (false) {
    implicit_cast<From*, To>(0);
  }

#if !defined(NDEBUG) && PROTOBUF_RTTI
  assert(f == nullptr || dynamic_cast<To>(f) != nullptr);  // RTTI: debug mode only!
#endif
  return static_cast<To>(f);
}